

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O1

uint32_t __thiscall
DnsStats::SkipDnsName(DnsStats *this,uint8_t *packet,uint32_t length,uint32_t start)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar4 = (ulong)start;
  if (start < length) {
    do {
      iVar2 = (int)uVar4;
      bVar1 = packet[uVar4];
      if (bVar1 == 0) {
        return iVar2 + 1;
      }
      if ((~(uint)bVar1 & 0xc0) == 0) {
        uVar3 = iVar2 + 2U;
        if (length <= iVar2 + 2U) {
          uVar3 = length;
        }
        return uVar3;
      }
      if ((0x3f < bVar1) || (length < iVar2 + (uint)bVar1 + 1)) {
        return length;
      }
      start = iVar2 + (uint)bVar1 + 1;
      uVar4 = (ulong)start;
    } while (start < length);
  }
  return start;
}

Assistant:

uint32_t DnsStats::SkipDnsName(uint8_t* packet, uint32_t length, uint32_t start)
{
    uint32_t l = 0;

    while (start < length) {
        l = packet[start];

        if (l == 0)
        {
            /* end of parsing*/
            start++;
            break;
        }
        else if ((l & 0xC0) == 0xC0)
        {
            if ((start + 2) > length)
            {
                /* error */
                start = length;
                break;
            }
            else
            {
                start += 2;
                break;
            }
        }
        else if (l > 0x3F)
        {
            /* found an extension. Don't know how to parse it! */
            start = length;
            break;
        }
        else
        {
            /* add a label to the name. */
            if (start + l + 1 > length)
            {
                /* format error */
                start = length;
                break;
            }
            else
            {
                start += l + 1;
            }
        }
    }

    return start;
}